

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

Symbol * ehf_findsymbol(GlobalVars *gv,Section *sec,char *name)

{
  long lVar1;
  int iVar2;
  unsigned_long uVar3;
  Section *in_RDX;
  GlobalVars *in_RSI;
  long in_RDI;
  Symbol *second_choice;
  Symbol *sym;
  Symbol *local_30;
  Symbol *local_8;
  
  lVar1 = *(long *)(in_RDI + 0x198);
  uVar3 = elf_hash((char *)in_RDX);
  local_8 = *(Symbol **)(lVar1 + (uVar3 & 0xffff) * 8);
  local_30 = (Symbol *)0x0;
  for (; local_8 != (Symbol *)0x0; local_8 = local_8->glob_chain) {
    iVar2 = strcmp((char *)in_RDX,local_8->name);
    if (iVar2 == 0) {
      if (local_30 == (Symbol *)0x0) {
        local_30 = local_8;
      }
      if (((in_RSI == (GlobalVars *)0x0) || (local_8->type != '\x02')) ||
         ((*(byte *)((long)&(in_RSI->inputlist).last + 5) & 0x20) ==
          (local_8->relsect->flags & 0x20))) break;
    }
  }
  if ((local_8 == (Symbol *)0x0) && (local_30 != (Symbol *)0x0)) {
    local_8 = local_30;
  }
  if ((local_8 != (Symbol *)0x0) && (local_8->type == '\x04')) {
    local_8 = ehf_findsymbol(in_RSI,in_RDX,(char *)local_8);
  }
  return local_8;
}

Assistant:

static struct Symbol *ehf_findsymbol(struct GlobalVars *gv,
                                     struct Section *sec,const char *name)
{
  struct Symbol *sym = gv->symbols[elf_hash(name)%SYMHTABSIZE];
  struct Symbol *second_choice = NULL;

  while (sym) {
    if (!strcmp(name,sym->name)) {
      if (second_choice == NULL)
        second_choice = sym;

      if (sec!=NULL && sym->type==SYM_RELOC) {
        /* we prefer symbols from a section which has the same CPU-flags
           as the caller's section */
        if ((sec->flags & SF_EHFPPC) == (sym->relsect->flags & SF_EHFPPC))
          break;
      }
      else
        break;
    }
    sym = sym->glob_chain;
  }

  /* accept symbol from a section for a different CPU, if it's the only one */
  if (!sym && second_choice)
    sym = second_choice;

  if (sym)
    if (sym->type == SYM_INDIR)
      return ehf_findsymbol(gv,sec,sym->indir_name);

  return sym;
}